

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ninja_test.cc
# Opt level: O2

bool __thiscall testing::Test::Check(Test *this,bool condition,char *file,int line,char *error)

{
  undefined7 in_register_00000031;
  string sStack_38;
  
  if ((int)CONCAT71(in_register_00000031,condition) == 0) {
    (anonymous_namespace)::StringPrintf_abi_cxx11_(&sStack_38,"*** Failure in %s:%d\n%s\n");
    LinePrinter::PrintOnNewLine(&printer,&sStack_38);
    std::__cxx11::string::~string((string *)&sStack_38);
    this->failed_ = true;
  }
  return condition;
}

Assistant:

bool testing::Test::Check(bool condition, const char* file, int line,
                          const char* error) {
  if (!condition) {
    printer.PrintOnNewLine(
        StringPrintf("*** Failure in %s:%d\n%s\n", file, line, error));
    failed_ = true;
  }
  return condition;
}